

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

int poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  pollfd *__k;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  stCoEpoll_t *psVar8;
  size_t i_1;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  nfds_t nfds;
  size_t i;
  nfds_t nVar12;
  pollfd *fds;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  if (g_sys_poll_func == (poll_pfn_t)0x0) {
    g_sys_poll_func = (poll_pfn_t)dlsym(0xffffffffffffffff,"poll");
  }
  bVar5 = co_is_enable_sys_hook();
  if (__timeout == 0 || !bVar5) {
    iVar6 = (*g_sys_poll_func)((pollfd *)__fds,__nfds,__timeout);
    return iVar6;
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nfds = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  fds = (pollfd *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (1 < __nfds) {
    fds = (pollfd *)malloc(__nfds * 8);
    nfds = 0;
    nVar12 = 0;
    do {
      __k = __fds + nVar12;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001046b5:
        *(pollfd *)(fds + nfds) = *__k;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&__k->fd);
        *pmVar7 = (mapped_type)nfds;
        nfds = nfds + 1;
      }
      else {
        iVar6 = __k->fd;
        p_Var10 = &p_Var1->_M_header;
        p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var11 = p_Var4;
          p_Var9 = p_Var10;
          _Var2 = p_Var11[1]._M_color;
          p_Var10 = p_Var11;
          if ((int)_Var2 < iVar6) {
            p_Var10 = p_Var9;
          }
          p_Var4 = (&p_Var11->_M_left)[(int)_Var2 < iVar6];
        } while ((&p_Var11->_M_left)[(int)_Var2 < iVar6] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var10 == p_Var1) goto LAB_001046b5;
        if ((int)_Var2 < iVar6) {
          p_Var11 = p_Var9;
        }
        if (iVar6 < (int)p_Var11[1]._M_color) goto LAB_001046b5;
        fds[*(int *)&p_Var10[1].field_0x4].events =
             fds[*(int *)&p_Var10[1].field_0x4].events | __k->events;
      }
      nVar12 = nVar12 + 1;
    } while (nVar12 != __nfds);
  }
  if (__nfds == 1 || nfds == __nfds) {
    psVar8 = co_get_epoll_ct();
    iVar6 = co_poll_inner(psVar8,(pollfd *)__fds,__nfds,__timeout,g_sys_poll_func);
  }
  else {
    psVar8 = co_get_epoll_ct();
    iVar6 = co_poll_inner(psVar8,fds,nfds,__timeout,g_sys_poll_func);
    if (__nfds != 0 && 0 < iVar6) {
      nVar12 = 0;
      do {
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          iVar3 = __fds[nVar12].fd;
          p_Var10 = &p_Var1->_M_header;
          p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var11 = p_Var4;
            p_Var9 = p_Var10;
            _Var2 = p_Var11[1]._M_color;
            p_Var10 = p_Var11;
            if ((int)_Var2 < iVar3) {
              p_Var10 = p_Var9;
            }
            p_Var4 = (&p_Var11->_M_left)[(int)_Var2 < iVar3];
          } while ((&p_Var11->_M_left)[(int)_Var2 < iVar3] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var10 != p_Var1) {
            if ((int)_Var2 < iVar3) {
              p_Var11 = p_Var9;
            }
            if ((int)p_Var11[1]._M_color <= iVar3) {
              __fds[nVar12].revents =
                   __fds[nVar12].events & fds[*(int *)&p_Var10[1].field_0x4].revents;
            }
          }
        }
        nVar12 = nVar12 + 1;
      } while (nVar12 != __nfds);
    }
  }
  free(fds);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return iVar6;
}

Assistant:

int poll(struct pollfd fds[], nfds_t nfds, int timeout)
{
	HOOK_SYS_FUNC( poll );

	if (!co_is_enable_sys_hook() || timeout == 0) {
		return g_sys_poll_func(fds, nfds, timeout);
	}
	pollfd *fds_merge = NULL;
	nfds_t nfds_merge = 0;
	std::map<int, int> m;  // fd --> idx
	std::map<int, int>::iterator it;
	if (nfds > 1) {
		fds_merge = (pollfd *)malloc(sizeof(pollfd) * nfds);
		for (size_t i = 0; i < nfds; i++) {
			if ((it = m.find(fds[i].fd)) == m.end()) {
				fds_merge[nfds_merge] = fds[i];
				m[fds[i].fd] = nfds_merge;
				nfds_merge++;
			} else {
				int j = it->second;
				fds_merge[j].events |= fds[i].events;  // merge in j slot
			}
		}
	}

	int ret = 0;
	if (nfds_merge == nfds || nfds == 1) {
		ret = co_poll_inner(co_get_epoll_ct(), fds, nfds, timeout, g_sys_poll_func);
	} else {
		ret = co_poll_inner(co_get_epoll_ct(), fds_merge, nfds_merge, timeout,
				g_sys_poll_func);
		if (ret > 0) {
			for (size_t i = 0; i < nfds; i++) {
				it = m.find(fds[i].fd);
				if (it != m.end()) {
					int j = it->second;
					fds[i].revents = fds_merge[j].revents & fds[i].events;
				}
			}
		}
	}
	free(fds_merge);
	return ret;


}